

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::base::RegisteredLoggers::unsafeFlushAll(RegisteredLoggers *this)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->m_logStreamsReference)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    if (p_Var1[5]._M_nxt != (_Hash_node_base *)0x0) {
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void RegisteredLoggers::unsafeFlushAll(void) {
  ELPP_INTERNAL_INFO(1, "Flushing all log files");
  for (base::LogStreamsReferenceMap::iterator it = m_logStreamsReference.begin();
       it != m_logStreamsReference.end(); ++it) {
    if (it->second.get() == nullptr) continue;
    it->second->flush();
  }
}